

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

string __thiscall mjs::object::class_name(object *this)

{
  undefined8 extraout_RDX;
  long in_RSI;
  string sVar1;
  gc_heap_ptr<mjs::gc_string> local_28;
  object *this_local;
  
  this_local = this;
  gc_heap_ptr_untracked<mjs::gc_string,_true>::track
            ((gc_heap_ptr_untracked<mjs::gc_string,_true> *)&local_28,(gc_heap *)(in_RSI + 0x10));
  string::string((string *)this,&local_28);
  gc_heap_ptr<mjs::gc_string>::~gc_heap_ptr(&local_28);
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar1.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string class_name() const { return class_.track(heap_); }